

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.hh
# Opt level: O0

void __thiscall QPDFNameTreeObjectHelper::iterator::iterator(iterator *this,iterator *param_1)

{
  iterator *param_1_local;
  iterator *this_local;
  
  this->_vptr_iterator = (_func_int **)&PTR__iterator_0058c430;
  std::shared_ptr<NNTreeIterator>::shared_ptr(&this->impl,&param_1->impl);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  ::pair(&this->ivalue,&param_1->ivalue);
  return;
}

Assistant:

class QPDF_DLL_PRIVATE iterator
    {
        friend class QPDFNameTreeObjectHelper;

      public:
        typedef std::pair<std::string, QPDFObjectHandle> T;
        using iterator_category = std::bidirectional_iterator_tag;
        using value_type = T;
        using difference_type = long;
        using pointer = T*;
        using reference = T&;

        virtual ~iterator() = default;
        QPDF_DLL
        bool valid() const;
        QPDF_DLL
        iterator& operator++();
        iterator
        operator++(int)
        {
            iterator t = *this;
            ++(*this);
            return t;
        }
        QPDF_DLL
        iterator& operator--();
        iterator
        operator--(int)
        {
            iterator t = *this;
            --(*this);
            return t;
        }
        QPDF_DLL
        reference operator*();
        QPDF_DLL
        pointer operator->();
        QPDF_DLL
        bool operator==(iterator const& other) const;
        bool
        operator!=(iterator const& other) const
        {
            return !operator==(other);
        }

        // DANGER: this method can create inconsistent trees if not used properly! Insert a new item
        // immediately after the current iterator and increment so that it points to the new item.
        // If the current iterator is end(), insert at the beginning. This method does not check for
        // proper ordering, so if you use it, you must ensure that the item you are inserting
        // belongs where you are putting it. The reason for this method is that it is more efficient
        // than insert() and can be used safely when you are creating a new tree and inserting items
        // in sorted order.
        QPDF_DLL
        void insertAfter(std::string const& key, QPDFObjectHandle value);

        // Remove the current item and advance the iterator to the next item.
        QPDF_DLL
        void remove();

      private:
        void updateIValue();

        iterator(std::shared_ptr<NNTreeIterator> const&);
        std::shared_ptr<NNTreeIterator> impl;
        value_type ivalue;
    }